

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O0

int zip_entry_isdir(zip_t *zip)

{
  size_t sVar1;
  bool local_1b;
  mz_uint16 entrylen;
  zip_t *zip_local;
  
  if (zip == (zip_t *)0x0) {
    zip_local._4_4_ = 0xffffffff;
  }
  else if ((zip->entry).index < 0) {
    zip_local._4_4_ = 0xfffffff6;
  }
  else {
    sVar1 = strlen((zip->entry).name);
    local_1b = true;
    if ((zip->entry).name[(int)((ushort)sVar1 - 1)] != '/') {
      local_1b = (zip->entry).name[(int)((ushort)sVar1 - 1)] == '\\';
    }
    zip_local._4_4_ = (uint)local_1b;
  }
  return zip_local._4_4_;
}

Assistant:

int zip_entry_isdir(struct zip_t *zip) {
  mz_uint16 entrylen;
  if (!zip) {
    // zip_t handler is not initialized
    return ZIP_ENOINIT;
  }

  if (zip->entry.index < (ssize_t)0) {
    // zip entry is not opened
    return ZIP_EINVIDX;
  }

  entrylen = (mz_uint16)strlen(zip->entry.name);
  return ISSLASH(zip->entry.name[entrylen - 1]);
}